

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations2Points1Line<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P2,Matrix<double,_4,_1,_0,_4,_1> *P1_B,
            Matrix<double,_4,_1,_0,_4,_1> *P2_B)

{
  XprTypeNested pMVar1;
  iterator __position;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 *puVar6;
  _Nested n;
  double *pdVar7;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar8;
  iterator iVar9;
  long lVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  RealScalar z_1;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  RealScalar z;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  RealScalar z_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Matrix<double,_3,_1,_0,_3,_1> v3;
  type tmp;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  Matrix<double,_4,_4,_0,_4,_4> TP_B;
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_4,_0,_4,_4> transV_B;
  Matrix<double,_4,_4,_0,_4,_4> transV;
  Matrix<double,_4,_1,_0,_4,_1> P2_B1;
  Matrix<double,_4,_1,_0,_4,_1> P2_1;
  undefined1 local_438 [16];
  double local_428;
  Matrix<double,_3,_1,_0,_3,_1> local_418;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_3f8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  Matrix<double,_4,_4,_0,_4,_4> local_378;
  Matrix<double,_4,_4,_0,_4,_4> local_2f8;
  double local_278 [12];
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  double local_1f8 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [120];
  undefined1 auStack_f0 [16];
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [32];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  bVar11 = 0;
  pdVar7 = local_1f8;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[8] = 0.0;
  local_1f8[9] = 0.0;
  local_1f8[10] = 0.0;
  local_1f8[0xb] = 0.0;
  local_1f8[0xf] = 0.0;
  lVar10 = 0;
  do {
    *pdVar7 = 1.0;
    lVar10 = lVar10 + 0x20;
    pdVar7 = pdVar7 + 5;
  } while (lVar10 != 0x80);
  dVar12 = -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
            array[0];
  dVar13 = -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
            array[1];
  local_1f8[0xe] =
       -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2]
  ;
  pdVar7 = local_278;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  local_278[8] = 0.0;
  local_278[9] = 0.0;
  local_278[10] = 0.0;
  local_278[0xb] = 0.0;
  dStack_200 = 0.0;
  lVar10 = 0;
  local_1f8[0xc] = dVar12;
  local_1f8[0xd] = dVar13;
  do {
    *pdVar7 = 1.0;
    lVar10 = lVar10 + 0x20;
    pdVar7 = pdVar7 + 5;
  } while (lVar10 != 0x80);
  dVar15 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  dVar16 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[1];
  local_218._8_4_ = SUB84(dVar16,0);
  local_218._0_8_ = -dVar15;
  local_218._12_4_ = (uint)((ulong)dVar16 >> 0x20) ^ 0x80000000;
  local_208 = -(P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data
               .array[2];
  dVar2 = (P2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (P2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar4 = (P2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar5 = (P2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  local_58 = dVar12 * dVar5 + local_1f8[8] * dVar4 + local_1f8[4] * dVar3 + local_1f8[0] * dVar2;
  dStack_50 = dVar13 * dVar5 + local_1f8[9] * dVar4 + local_1f8[5] * dVar3 + local_1f8[1] * dVar2;
  local_48 = dVar5 * local_1f8[0xe] +
             dVar4 * local_1f8[10] + dVar3 * local_1f8[6] + dVar2 * local_1f8[2];
  dStack_40 = dVar5 * local_1f8[0xf] +
              dVar4 * local_1f8[0xb] + dVar3 * local_1f8[7] + dVar2 * local_1f8[3];
  dVar13 = (P2_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  dVar2 = (P2_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  dVar3 = (P2_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  dVar4 = (P2_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[3];
  local_78._0_8_ =
       (local_278[8] * dVar3 + local_278[4] * dVar2 + local_278[0] * dVar13) - dVar15 * dVar4;
  local_78._8_8_ =
       (local_278[9] * dVar3 + local_278[5] * dVar2 + local_278[1] * dVar13) - dVar16 * dVar4;
  dVar12 = dVar4 * dStack_200 +
           dVar3 * local_278[0xb] + dVar2 * local_278[7] + dVar13 * local_278[3];
  local_78._24_4_ = SUB84(dVar12,0);
  local_78._16_8_ =
       dVar4 * local_208 + dVar3 * local_278[10] + dVar2 * local_278[6] + dVar13 * local_278[2];
  local_78._28_4_ = (int)((ulong)dVar12 >> 0x20);
  puVar6 = (undefined8 *)(local_168 + 0x70);
  local_168._112_8_ = 0.0;
  auStack_f0._0_8_ = 0.0;
  auStack_f0._8_8_ = 0.0;
  dStack_e0 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  lVar10 = 0;
  do {
    *puVar6 = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x20;
    puVar6 = puVar6 + 5;
  } while (lVar10 != 0x80);
  puVar6 = (undefined8 *)local_178;
  local_168._96_8_ = 0.0;
  local_168._104_8_ = 0.0;
  local_168._80_8_ = 0.0;
  local_168._88_8_ = 0.0;
  local_168._64_8_ = 0.0;
  local_168._72_8_ = 0.0;
  local_168._48_8_ = 0.0;
  local_168._56_8_ = 0.0;
  local_168._32_8_ = 0.0;
  local_168._40_8_ = 0.0;
  local_168._16_8_ = 0.0;
  local_168._24_8_ = 0.0;
  local_168._0_8_ = 0.0;
  local_168._8_8_ = 0.0;
  local_178._0_8_ = 0.0;
  local_178._8_8_ = 0.0;
  lVar10 = 0;
  do {
    *puVar6 = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x20;
    puVar6 = puVar6 + 5;
  } while (lVar10 != 0x80);
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       &stack0xffffffffffffffa8;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride = 4
  ;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)
       local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            ((PlainObject *)&local_378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_3f8);
  if (local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] != 1.48219693752374e-323) {
LAB_0014c7cc:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                 );
  }
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  auVar25._0_8_ =
       -local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2];
  auVar25._8_8_ = 0x8000000000000000;
  dVar12 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1] * 0.0 -
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0];
  dVar13 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1] -
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0] * 0.0;
  auVar18._0_8_ =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2] + local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[1] * -0.0;
  local_438._0_8_ =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2] * 0.0 +
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1] * -0.0;
  local_438._8_8_ =
       local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0] * 0.0 + auVar25._0_8_;
  dVar15 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[2] * -0.0 +
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0] * 0.0;
  auVar18._8_8_ = dVar15;
  dVar16 = dVar13 * dVar13 +
           (double)local_438._8_8_ * (double)local_438._8_8_ +
           (double)local_438._0_8_ * (double)local_438._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar16;
  auVar20 = sqrtpd(auVar25,auVar20);
  dVar15 = dVar12 * dVar12 + dVar15 * dVar15 + auVar18._0_8_ * auVar18._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar15;
  auVar25 = sqrtpd(auVar24,auVar24);
  auVar21._0_8_ = auVar20._0_8_;
  auVar26._0_8_ = auVar25._0_8_;
  if (auVar26._0_8_ <= auVar21._0_8_) {
    if (0.0 < dVar16) {
      auVar21._8_8_ = auVar21._0_8_;
      local_438 = divpd(local_438,auVar21);
    }
    local_428 = (double)(~-(ulong)(0.0 < dVar16) & (ulong)dVar13 |
                        (ulong)(dVar13 / auVar21._0_8_) & -(ulong)(0.0 < dVar16));
  }
  else {
    local_438 = auVar18;
    if (0.0 < dVar15) {
      auVar26._8_8_ = auVar26._0_8_;
      local_438 = divpd(auVar18,auVar26);
    }
    local_428 = (double)(~-(ulong)(0.0 < dVar15) & (ulong)dVar12 |
                        (ulong)(dVar12 / auVar26._0_8_) & -(ulong)(0.0 < dVar15));
  }
  pMVar1 = (XprTypeNested)(local_168 + 0x70);
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 1;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride = 4
  ;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)pMVar1;
  local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr = pMVar1;
  local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_438;
  Eigen::internal::
  check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
            (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_378);
  if (((double)local_3f8.
               super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
               m_rows.m_value == 4.94065645841247e-324) &&
     ((double)local_3f8.
              super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
              m_cols.m_value == 1.48219693752374e-323)) {
    lVar10 = 0;
    do {
      *(undefined8 *)
       ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
               local_3f8.
               super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
               m_data)->m_storage).m_data.array + lVar10 * 4) =
           *(undefined8 *)
            ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0])->m_storage).m_data.array + lVar10);
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x18);
    local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = local_428 *
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] -
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * (double)local_438._8_8_;
    local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)local_438._0_8_ *
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] -
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * local_428;
    local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * (double)local_438._8_8_ -
           (double)local_438._0_8_ *
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)auStack_f0;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = 1;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
    m_value = 1;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride =
         4;
    local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr = pMVar1;
    local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&local_378;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2f8);
    if (((double)local_3f8.
                 super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                 .m_rows.m_value == 4.94065645841247e-324) &&
       ((double)local_3f8.
                super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
                m_cols.m_value == 1.48219693752374e-323)) {
      lVar10 = 0;
      do {
        *(undefined8 *)
         ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 local_3f8.
                 super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                 .m_data)->m_storage).m_data.array + lVar10 * 4) =
             *(undefined8 *)
              ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                      local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0])->m_storage).m_data.array + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)(auStack_f0 + 8);
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 1;
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 2;
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           pMVar1;
      local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)&local_418;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_378);
      if (((double)local_3f8.
                   super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                   .m_rows.m_value == 4.94065645841247e-324) &&
         ((double)local_3f8.
                  super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                  .m_cols.m_value == 1.48219693752374e-323)) {
        lVar10 = 0;
        do {
          *(undefined8 *)
           ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                   local_3f8.
                   super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                   .m_data)->m_storage).m_data.array + lVar10 * 4) =
               *(undefined8 *)
                ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0])->m_storage).m_data.array + lVar10);
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x18);
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             (PointerType)local_78;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)
             local_3f8.
             super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
             m_data;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
        normalized((PlainObject *)&local_378,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   &local_3f8);
        if (local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] != 1.48219693752374e-323) goto LAB_0014c7cc;
        local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        dVar12 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] * 0.0 -
                 local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
        dVar13 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] -
                 local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0] * 0.0;
        local_438._0_8_ =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2] +
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[1] * -0.0;
        auVar14._0_8_ =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2] * 0.0 +
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[1] * -0.0;
        auVar14._8_8_ =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[0] * 0.0 +
             -local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2];
        dVar15 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] * -0.0 +
                 local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0] * 0.0;
        local_438._8_8_ = dVar15;
        dVar16 = dVar13 * dVar13 + auVar14._8_8_ * auVar14._8_8_ + auVar14._0_8_ * auVar14._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar16;
        auVar18 = sqrtpd(auVar17,auVar17);
        dVar15 = dVar12 * dVar12 +
                 dVar15 * dVar15 + (double)local_438._0_8_ * (double)local_438._0_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar15;
        auVar20 = sqrtpd(auVar22,auVar22);
        auVar19._0_8_ = auVar18._0_8_;
        auVar23._0_8_ = auVar20._0_8_;
        if (auVar23._0_8_ <= auVar19._0_8_) {
          local_428 = (double)(~-(ulong)(0.0 < dVar16) & (ulong)dVar13 |
                              (ulong)(dVar13 / auVar19._0_8_) & -(ulong)(0.0 < dVar16));
          local_438 = auVar14;
          if (0.0 < dVar16) {
            auVar19._8_8_ = auVar19._0_8_;
            local_438 = divpd(auVar14,auVar19);
          }
        }
        else {
          local_428 = (double)(~-(ulong)(0.0 < dVar15) & (ulong)dVar12 |
                              (ulong)(dVar12 / auVar23._0_8_) & -(ulong)(0.0 < dVar15));
          if (0.0 < dVar15) {
            auVar23._8_8_ = auVar23._0_8_;
            local_438 = divpd(local_438,auVar23);
          }
        }
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 1;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 3;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol
        .m_value = 0;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             (PointerType)local_178;
        local_3f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)local_178;
        local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_438;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                  (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_378);
        if (((double)local_3f8.
                     super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                     .m_rows.m_value == 4.94065645841247e-324) &&
           ((double)local_3f8.
                    super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                    .m_cols.m_value == 1.48219693752374e-323)) {
          lVar10 = 0;
          do {
            *(undefined8 *)
             ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                     local_3f8.
                     super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                     .m_data)->m_storage).m_data.array + lVar10 * 4) =
                 *(undefined8 *)
                  ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0])->m_storage).m_data.array + lVar10);
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x18);
          local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = local_428 *
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1] -
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] * (double)local_438._8_8_;
          local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] = (double)local_438._0_8_ *
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] -
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0] * local_428;
          local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0] * (double)local_438._8_8_ -
                     (double)local_438._0_8_ *
                     local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data
               = (PointerType)(local_178 + 8);
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows
          .m_value = 1;
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols
          .m_value = 3;
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          m_startRow.m_value = 1;
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          m_startCol.m_value = 0;
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          m_outerStride = 4;
          local_3f8.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
               (XprTypeNested)local_178;
          local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = (double)&local_378;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                    (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2f8);
          if (((double)local_3f8.
                       super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                       .m_rows.m_value == 4.94065645841247e-324) &&
             ((double)local_3f8.
                      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                      .m_cols.m_value == 1.48219693752374e-323)) {
            lVar10 = 0;
            do {
              *(undefined8 *)
               ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                       local_3f8.
                       super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                       .m_data)->m_storage).m_data.array + lVar10 * 4) =
                   *(undefined8 *)
                    ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0])->m_storage).m_data.array + lVar10);
              lVar10 = lVar10 + 8;
            } while (lVar10 != 0x18);
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
            m_data = (PointerType)local_168;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
            m_rows.m_value = 1;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
            m_cols.m_value = 3;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            m_startRow.m_value = 2;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            m_startCol.m_value = 0;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            m_outerStride = 4;
            local_3f8.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
                 (XprTypeNested)local_178;
            local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = (double)&local_418;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                      (&local_3f8,(Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_378);
            if (((double)local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_rows.m_value == 4.94065645841247e-324) &&
               ((double)local_3f8.
                        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                        .m_cols.m_value == 1.48219693752374e-323)) {
              lVar10 = 0;
              do {
                *(undefined8 *)
                 ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                         local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_data)->m_storage).m_data.array + lVar10 * 4) =
                     *(undefined8 *)
                      ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[0])->m_storage).m_data.array + lVar10);
                lVar10 = lVar10 + 8;
              } while (lVar10 != 0x18);
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar10 = 0;
              do {
                dVar12 = *(double *)((long)local_1f8 + lVar10);
                dVar13 = *(double *)((long)local_1f8 + lVar10 + 8);
                dVar15 = *(double *)((long)local_1f8 + lVar10 + 0x10);
                dVar16 = *(double *)((long)local_1f8 + lVar10 + 0x18);
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_data + lVar10) =
                     local_98 * dVar16 +
                     local_b8 * dVar15 + local_d8 * dVar13 + (double)local_168._112_8_ * dVar12;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_rows + lVar10) =
                     dStack_90 * dVar16 +
                     dStack_b0 * dVar15 + dStack_d0 * dVar13 + (double)auStack_f0._0_8_ * dVar12;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_cols + lVar10) =
                     dVar16 * local_88 +
                     dVar15 * local_a8 + dVar13 * local_c8 + dVar12 * (double)auStack_f0._8_8_;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .m_xpr + lVar10) =
                     dVar16 * dStack_80 +
                     dVar15 * dStack_a0 + dVar13 * dStack_c0 + dVar12 * dStack_e0;
                lVar10 = lVar10 + 0x20;
              } while (lVar10 != 0x80);
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_data;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_rows.m_value;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_cols.m_value;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[3] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_xpr;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[4] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_startRow.m_value;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[5] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_startCol.m_value;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[6] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_outerStride;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[7] = dStack_3c0;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[8] = local_3b8;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[9] = dStack_3b0;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[10] = local_3a8;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xb] = dStack_3a0;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc] = local_398;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xd] = dStack_390;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xe] = local_388;
              local_378.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xf] = dStack_380;
              std::
              vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
              ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                        ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                          *)__return_storage_ptr__,(iterator)0x0,&local_378);
              lVar10 = 0;
              do {
                dVar12 = *(double *)((long)local_278 + lVar10);
                dVar13 = *(double *)((long)local_278 + lVar10 + 8);
                dVar15 = *(double *)((long)local_278 + lVar10 + 0x10);
                dVar16 = *(double *)((long)local_278 + lVar10 + 0x18);
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_data + lVar10) =
                     (double)local_168._80_8_ * dVar16 +
                     (double)local_168._48_8_ * dVar15 +
                     (double)local_168._16_8_ * dVar13 + (double)local_178._0_8_ * dVar12;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_rows + lVar10) =
                     (double)local_168._88_8_ * dVar16 +
                     (double)local_168._56_8_ * dVar15 +
                     (double)local_168._24_8_ * dVar13 + (double)local_178._8_8_ * dVar12;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                         .m_cols + lVar10) =
                     dVar16 * (double)local_168._96_8_ +
                     dVar15 * (double)local_168._64_8_ +
                     dVar13 * (double)local_168._32_8_ + dVar12 * (double)local_168._0_8_;
                *(double *)
                 ((long)&local_3f8.
                         super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                         .m_xpr + lVar10) =
                     dVar16 * (double)local_168._104_8_ +
                     dVar15 * (double)local_168._72_8_ +
                     dVar13 * (double)local_168._40_8_ + dVar12 * (double)local_168._8_8_;
                lVar10 = lVar10 + 0x20;
              } while (lVar10 != 0x80);
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_data;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_rows.m_value;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_cols.m_value;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[3] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_xpr;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[4] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_startRow.m_value;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[5] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_startCol.m_value;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[6] =
                   (double)local_3f8.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .m_outerStride;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[7] = dStack_3c0;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[8] = local_3b8;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[9] = dStack_3b0;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[10] = local_3a8;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xb] = dStack_3a0;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc] = local_398;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xd] = dStack_390;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xe] = local_388;
              local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xf] = dStack_380;
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                            *)__return_storage_ptr__,__position,&local_2f8);
              }
              else {
                pMVar8 = &local_2f8;
                iVar9._M_current = __position._M_current;
                for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
                  ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                  .m_storage.m_data.array[0] =
                       (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                       m_storage.m_data.array[0];
                  pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)
                           ((long)pMVar8 + ((ulong)bVar11 * -2 + 1) * 8);
                  iVar9._M_current =
                       (Matrix<double,_4,_4,_0,_4,_4> *)
                       ((long)iVar9._M_current + ((ulong)bVar11 * -2 + 1) * 8);
                }
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 4, 4>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations2Points1Line(Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P2, Matrix<floatPrec, 4,1> P1_B, Matrix<floatPrec, 4,1> P2_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> P2_1, P2_B1;
	P2_1 = transU * P2;
	P2_B1 = transU_B * P2_B;

	// align Z axis to the direction of P1 -> P2
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = P2_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = P2_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}